

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_resume(lua_State *L,int nargs)

{
  TValue *pTVar1;
  GCstr *pGVar2;
  TValue *local_98;
  int nargs_local;
  lua_State *L_local;
  
  if ((L->cframe == (void *)0x0) && (L->status < 2)) {
    if (L->status == '\0') {
      local_98 = api_call_base(L,nargs);
    }
    else {
      local_98 = L->top + -(long)nargs;
    }
    L_local._4_4_ = lj_vm_resume(L,local_98,0,0);
  }
  else {
    L->top = L->base;
    pTVar1 = L->top;
    pGVar2 = lj_err_str(L,LJ_ERR_COSUSP);
    pTVar1->u64 = (ulong)pGVar2 | 0xfffd800000000000;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
      lj_state_growstack1(L);
    }
    L_local._4_4_ = 2;
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_resume(lua_State *L, int nargs)
{
  if (L->cframe == NULL && L->status <= LUA_YIELD)
    return lj_vm_resume(L,
      L->status == LUA_OK ? api_call_base(L, nargs) : L->top - nargs,
      0, 0);
  L->top = L->base;
  setstrV(L, L->top, lj_err_str(L, LJ_ERR_COSUSP));
  incr_top(L);
  return LUA_ERRRUN;
}